

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_scan_line(Parser *this)

{
  State *pSVar1;
  ulong offset;
  csubstr buf;
  size_t sVar2;
  char *pcVar3;
  
  pSVar1 = this->m_state;
  offset = (pSVar1->pos).super_LineCol.offset;
  if (offset < (this->m_buf).len) {
    buf.str = (this->m_buf).str;
    buf.len = (this->m_buf).len;
    LineContents::reset_with_next_line(&pSVar1->line_contents,buf,offset);
    return;
  }
  pcVar3 = (this->m_buf).str + (this->m_buf).len;
  (pSVar1->line_contents).full.str = pcVar3;
  (pSVar1->line_contents).full.len = 0;
  (pSVar1->line_contents).stripped.str = pcVar3;
  (pSVar1->line_contents).stripped.len = 0;
  (pSVar1->line_contents).rem.str = pcVar3;
  (pSVar1->line_contents).rem.len = 0;
  sVar2 = basic_substring<const_char>::first_not_of(&(pSVar1->line_contents).full,' ',0);
  (pSVar1->line_contents).indentation = sVar2;
  return;
}

Assistant:

void Parser::_scan_line()
{
    if(m_state->pos.offset >= m_buf.len)
    {
        m_state->line_contents.reset(m_buf.last(0), m_buf.last(0));
        return;
    }
    m_state->line_contents.reset_with_next_line(m_buf, m_state->pos.offset);
}